

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_zstd.c
# Opt level: O2

int archive_compressor_zstd_options(archive_write_filter *f,char *key,char *value)

{
  undefined4 *puVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  intmax_t in_RAX;
  long lVar5;
  size_t *psVar6;
  undefined1 auVar7 [16];
  intmax_t long_distance;
  
  puVar1 = (undefined4 *)f->data;
  long_distance = in_RAX;
  iVar2 = strcmp(key,"compression-level");
  if (iVar2 == 0) {
    iVar2 = string_to_number(value,&long_distance);
    if (iVar2 != 0) {
      return -0x14;
    }
    iVar2 = ZSTD_maxCLevel();
    uVar3 = ZSTD_versionNumber();
    if (uVar3 < 0x2842) {
      uVar3 = ZSTD_versionNumber();
      lVar5 = -99;
      if (uVar3 < 0x2840) {
        lVar5 = 0;
      }
    }
    else {
      iVar4 = ZSTD_minCLevel();
      lVar5 = (long)iVar4;
    }
    if (lVar5 <= long_distance) {
      if (long_distance <= iVar2) {
        *puVar1 = (int)long_distance;
        return 0;
      }
      return -0x14;
    }
    return -0x14;
  }
  iVar2 = strcmp(key,"threads");
  if (iVar2 == 0) {
    iVar2 = string_to_number(value,&long_distance);
    if (iVar2 != 0) {
      return -0x14;
    }
    if (long_distance == 0) {
      long_distance = sysconf(0x54);
    }
    if ((ulong)long_distance < 0x80000000) {
      puVar1[1] = (int)long_distance;
      return 0;
    }
    return -0x14;
  }
  iVar2 = strcmp(key,"frame-per-file");
  if (iVar2 == 0) {
    puVar1[4] = 1;
    return 0;
  }
  iVar2 = strcmp(key,"min-frame-in");
  if (iVar2 == 0) {
    psVar6 = (size_t *)(puVar1 + 6);
  }
  else {
    iVar2 = strcmp(key,"min-frame-out");
    if ((iVar2 != 0) && (iVar2 = strcmp(key,"min-frame-size"), iVar2 != 0)) {
      iVar2 = strcmp(key,"max-frame-in");
      if ((iVar2 == 0) || (iVar2 = strcmp(key,"max-frame-size"), iVar2 == 0)) {
        psVar6 = (size_t *)(puVar1 + 8);
      }
      else {
        iVar2 = strcmp(key,"max-frame-out");
        if (iVar2 != 0) {
          iVar2 = strcmp(key,"long");
          if (iVar2 != 0) {
            return -0x14;
          }
          iVar2 = string_to_number(value,&long_distance);
          if (iVar2 == 0) {
            auVar7 = ZSTD_cParam_getBounds(0x65);
            iVar2 = ZSTD_isError(auVar7._0_8_);
            if (iVar2 == 0) {
              if (auVar7._12_4_ < (int)long_distance || (int)long_distance < auVar7._8_4_) {
                return -0x14;
              }
            }
            else if ((int)long_distance - 0x20U < 0xffffffea) {
              return -0x14;
            }
            puVar1[2] = (int)long_distance;
            return 0;
          }
          return -0x14;
        }
        psVar6 = (size_t *)(puVar1 + 0xc);
      }
      iVar2 = string_to_size(value,psVar6);
      if (iVar2 != 0) {
        return -0x14;
      }
      if (0x3ff < *psVar6) {
        return 0;
      }
      return -0x14;
    }
    psVar6 = (size_t *)(puVar1 + 10);
  }
  iVar2 = string_to_size(value,psVar6);
  if (iVar2 == 0) {
    return 0;
  }
  return -0x14;
}

Assistant:

static int
archive_compressor_zstd_options(struct archive_write_filter *f, const char *key,
    const char *value)
{
	struct private_data *data = (struct private_data *)f->data;

	if (strcmp(key, "compression-level") == 0) {
		intmax_t level;
		if (string_to_number(value, &level) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		/* If we don't have the library, hard-code the max level */
		int minimum = CLEVEL_MIN;
		int maximum = CLEVEL_MAX;
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
		maximum = ZSTD_maxCLevel();
#if ZSTD_VERSION_NUMBER >= MINVER_MINCLEVEL
		if (ZSTD_versionNumber() >= MINVER_MINCLEVEL) {
			minimum = ZSTD_minCLevel();
		}
		else
#endif
		if (ZSTD_versionNumber() < MINVER_NEGCLEVEL) {
			minimum = CLEVEL_STD_MIN;
		}
#endif
		if (level < minimum || level > maximum) {
			return (ARCHIVE_WARN);
		}
		data->compression_level = (int)level;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "threads") == 0) {
		intmax_t threads;
		if (string_to_number(value, &threads) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}

#if defined(HAVE_SYSCONF) && defined(_SC_NPROCESSORS_ONLN)
		if (threads == 0) {
			threads = sysconf(_SC_NPROCESSORS_ONLN);
		}
#elif !defined(__CYGWIN__) && defined(_WIN32_WINNT) && \
    _WIN32_WINNT >= 0x0601 /* _WIN32_WINNT_WIN7 */
		if (threads == 0) {
			DWORD winCores = GetActiveProcessorCount(
			    ALL_PROCESSOR_GROUPS);
			threads = (intmax_t)winCores;
		}
#endif
		if (threads < 0 || threads > INT_MAX) {
			return (ARCHIVE_WARN);
		}
		data->threads = (int)threads;
		return (ARCHIVE_OK);
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
	} else if (strcmp(key, "frame-per-file") == 0) {
		data->frame_per_file = 1;
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-in") == 0) {
		if (string_to_size(value, &data->min_frame_in) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "min-frame-out") == 0 ||
	    strcmp(key, "min-frame-size") == 0) {
		if (string_to_size(value, &data->min_frame_out) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-in") == 0 ||
	    strcmp(key, "max-frame-size") == 0) {
		if (string_to_size(value, &data->max_frame_in) != ARCHIVE_OK ||
		    data->max_frame_in < 1024) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
	} else if (strcmp(key, "max-frame-out") == 0) {
		if (string_to_size(value, &data->max_frame_out) != ARCHIVE_OK ||
		    data->max_frame_out < 1024) {
			return (ARCHIVE_WARN);
		}
		return (ARCHIVE_OK);
#endif
	}
	else if (strcmp(key, "long") == 0) {
		intmax_t long_distance;
		if (string_to_number(value, &long_distance) != ARCHIVE_OK) {
			return (ARCHIVE_WARN);
		}
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream && ZSTD_VERSION_NUMBER >= MINVER_LONG
		ZSTD_bounds bounds = ZSTD_cParam_getBounds(ZSTD_c_windowLog);
		if (ZSTD_isError(bounds.error)) {
			int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
			if (((int)long_distance) < 10 || (int)long_distance > max_distance)
				return (ARCHIVE_WARN);
		} else {
			if ((int)long_distance < bounds.lowerBound || (int)long_distance > bounds.upperBound)
				return (ARCHIVE_WARN);
		}
#else
		int max_distance = ((int)(sizeof(size_t) == 4 ? 30 : 31));
		if (((int)long_distance) < 10 || (int)long_distance > max_distance)
		    return (ARCHIVE_WARN);
#endif
		data->long_distance = (int)long_distance;
		return (ARCHIVE_OK);
	}

	/* Note: The "warn" return is just to inform the options
	 * supervisor that we didn't handle it.  It will generate
	 * a suitable error if no one used this option. */
	return (ARCHIVE_WARN);
}